

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_AlreadyDefinedInPackage_Test::
~ValidationErrorTest_AlreadyDefinedInPackage_Test
          (ValidationErrorTest_AlreadyDefinedInPackage_Test *this)

{
  ValidationErrorTest_AlreadyDefinedInPackage_Test *this_local;
  
  ~ValidationErrorTest_AlreadyDefinedInPackage_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, AlreadyDefinedInPackage) {
  BuildFileWithErrors(
      "name: \"foo.proto\" "
      "package: \"foo.bar\" "
      "message_type { name: \"Foo\" }"
      "message_type { name: \"Foo\" }",

      "foo.proto: foo.bar.Foo: NAME: \"Foo\" is already defined in "
      "\"foo.bar\".\n");
}